

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

bool __thiscall
GenericTransactionSignatureChecker<CTransaction>::CheckSequence
          (GenericTransactionSignatureChecker<CTransaction> *this,CScriptNum *nSequence)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  const_reference pvVar4;
  int64_t *in_RDI;
  long in_FS_OFFSET;
  uint32_t nLockTimeMask;
  int64_t txToSequence;
  CScriptNum nSequenceMasked;
  int64_t txToSequenceMasked;
  bool local_62;
  bool local_61;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 uVar5;
  bool local_31;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar4 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                     ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                      CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                      (size_type)in_RDI);
  if (*(uint *)(in_RDI[1] + 0x30) < 2) {
    local_31 = false;
    goto LAB_01027429;
  }
  if ((pvVar4->nSequence & 0x80000000) != 0) {
    local_31 = false;
    goto LAB_01027429;
  }
  uVar5 = 0x40ffff;
  uVar3 = pvVar4->nSequence & 0x40ffff;
  CScriptNum::operator&((CScriptNum *)CONCAT44(0x40ffff,in_stack_ffffffffffffffa8),in_RDI);
  if (uVar3 < 0x400000) {
    bVar2 = CScriptNum::operator<((CScriptNum *)CONCAT44(uVar5,in_stack_ffffffffffffffa8),in_RDI);
    local_61 = true;
    if (!bVar2) goto LAB_010273c0;
  }
  else {
LAB_010273c0:
    local_62 = false;
    if (0x3fffff < uVar3) {
      local_62 = CScriptNum::operator>=
                           ((CScriptNum *)CONCAT44(uVar5,in_stack_ffffffffffffffa8),in_RDI);
    }
    local_61 = local_62;
  }
  if (((local_61 ^ 0xffU) & 1) == 0) {
    bVar2 = CScriptNum::operator>((CScriptNum *)CONCAT44(uVar5,in_stack_ffffffffffffffa8),in_RDI);
    if (bVar2) {
      local_31 = false;
    }
    else {
      local_31 = true;
    }
  }
  else {
    local_31 = false;
  }
LAB_01027429:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_31;
  }
  __stack_chk_fail();
}

Assistant:

bool GenericTransactionSignatureChecker<T>::CheckSequence(const CScriptNum& nSequence) const
{
    // Relative lock times are supported by comparing the passed
    // in operand to the sequence number of the input.
    const int64_t txToSequence = (int64_t)txTo->vin[nIn].nSequence;

    // Fail if the transaction's version number is not set high
    // enough to trigger BIP 68 rules.
    if (txTo->version < 2)
        return false;

    // Sequence numbers with their most significant bit set are not
    // consensus constrained. Testing that the transaction's sequence
    // number do not have this bit set prevents using this property
    // to get around a CHECKSEQUENCEVERIFY check.
    if (txToSequence & CTxIn::SEQUENCE_LOCKTIME_DISABLE_FLAG)
        return false;

    // Mask off any bits that do not have consensus-enforced meaning
    // before doing the integer comparisons
    const uint32_t nLockTimeMask = CTxIn::SEQUENCE_LOCKTIME_TYPE_FLAG | CTxIn::SEQUENCE_LOCKTIME_MASK;
    const int64_t txToSequenceMasked = txToSequence & nLockTimeMask;
    const CScriptNum nSequenceMasked = nSequence & nLockTimeMask;

    // There are two kinds of nSequence: lock-by-blockheight
    // and lock-by-blocktime, distinguished by whether
    // nSequenceMasked < CTxIn::SEQUENCE_LOCKTIME_TYPE_FLAG.
    //
    // We want to compare apples to apples, so fail the script
    // unless the type of nSequenceMasked being tested is the same as
    // the nSequenceMasked in the transaction.
    if (!(
        (txToSequenceMasked <  CTxIn::SEQUENCE_LOCKTIME_TYPE_FLAG && nSequenceMasked <  CTxIn::SEQUENCE_LOCKTIME_TYPE_FLAG) ||
        (txToSequenceMasked >= CTxIn::SEQUENCE_LOCKTIME_TYPE_FLAG && nSequenceMasked >= CTxIn::SEQUENCE_LOCKTIME_TYPE_FLAG)
    )) {
        return false;
    }

    // Now that we know we're comparing apples-to-apples, the
    // comparison is a simple numeric one.
    if (nSequenceMasked > txToSequenceMasked)
        return false;

    return true;
}